

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

UINT8 ymz280b_read_memory(ymz280b_state *chip,UINT32 offset)

{
  UINT32 offset_local;
  ymz280b_state *chip_local;
  
  if ((offset & 0xffffff) < chip->mem_size) {
    chip_local._7_1_ = chip->mem_base[offset & 0xffffff];
  }
  else {
    chip_local._7_1_ = '\0';
  }
  return chip_local._7_1_;
}

Assistant:

INLINE UINT8 ymz280b_read_memory(ymz280b_state *chip, UINT32 offset)
{
	//if (chip->ext_read_handler == NULL)
	{
		offset &= 0xFFFFFF;
		if (offset < chip->mem_size)
			return chip->mem_base[offset];
		else
			return 0;
	}
	//else
	//	return chip->ext_read_handler(chip->ext_param, offset);
}